

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  _func_void_j_compress_ptr *p_Var16;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar3[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      *(uint *)&pjVar3[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar3[4].start_pass = *(int *)&pjVar3[4].start_pass + -1;
  }
  paJVar4 = *MCU_data;
  lVar9 = (long)cinfo->Se;
  if (0 < lVar9) {
    do {
      sVar1 = (*paJVar4)[jpeg_natural_order[lVar9]];
      uVar8 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar8 = -uVar8;
      }
      if (uVar8 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_0012a1e7;
      bVar5 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar5);
    lVar9 = 0;
  }
LAB_0012a1e7:
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar15 = cinfo->Ss;
  if (iVar15 <= (int)lVar9) {
LAB_0012a21b:
    p_Var16 = (&pjVar3[9].finish_pass)[iVar2];
    lVar11 = (long)(iVar15 * 3 + -3);
    arith_encode(cinfo,(uchar *)(p_Var16 + lVar11),0);
    piVar12 = jpeg_natural_order + iVar15;
    p_Var16 = p_Var16 + lVar11 + 2;
    iVar10 = iVar15;
    do {
      sVar1 = (*paJVar4)[*piVar12];
      uVar8 = (uint)sVar1;
      if (sVar1 < 0) {
        bVar6 = (byte)cinfo->Al & 0x1f;
        uVar13 = -uVar8 >> bVar6;
        if (-uVar8 >> bVar6 != 0) {
          arith_encode(cinfo,(uchar *)(p_Var16 + -1),1);
          iVar15 = 1;
          goto LAB_0012a2de;
        }
      }
      else {
        bVar6 = (byte)cinfo->Al & 0x1f;
        uVar13 = uVar8 >> bVar6;
        if (uVar8 >> bVar6 != 0) goto LAB_0012a2a3;
      }
      arith_encode(cinfo,(uchar *)(p_Var16 + -1),0);
      iVar10 = iVar10 + 1;
      piVar12 = piVar12 + 1;
      p_Var16 = p_Var16 + 3;
    } while( true );
  }
LAB_0012a3d6:
  if (iVar15 <= cinfo->Se) {
    arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar15 * 3 + -3)),1);
  }
  return 1;
LAB_0012a2a3:
  arith_encode(cinfo,(uchar *)(p_Var16 + -1),1);
  iVar15 = 0;
LAB_0012a2de:
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),iVar15);
  uVar8 = uVar13 - 1;
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1;
    arith_encode(cinfo,(uchar *)p_Var16,1);
    if (uVar8 != 1) {
      arith_encode(cinfo,(uchar *)p_Var16,1);
      lVar11 = 0xbd;
      if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar10) {
        lVar11 = 0xd9;
      }
      p_Var16 = (&pjVar3[9].finish_pass)[iVar2] + lVar11;
      uVar7 = 2;
      uVar14 = uVar8;
      if (4 < uVar13) {
        do {
          arith_encode(cinfo,(uchar *)p_Var16,1);
          uVar7 = uVar7 * 2;
          p_Var16 = p_Var16 + 1;
          bVar5 = 7 < uVar14;
          uVar14 = uVar14 >> 1;
        } while (bVar5);
      }
    }
  }
  arith_encode(cinfo,(uchar *)p_Var16,0);
  if (1 < uVar7) {
    do {
      uVar7 = (int)uVar7 >> 1;
      arith_encode(cinfo,(uchar *)(p_Var16 + 0xe),(uint)((uVar7 & uVar8) != 0));
    } while (1 < uVar7);
  }
  iVar15 = iVar10 + 1;
  if ((int)lVar9 <= iVar10) goto code_r0x0012a3d0;
  goto LAB_0012a21b;
code_r0x0012a3d0:
  iVar15 = iVar10 + 1;
  goto LAB_0012a3d6;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);         /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 0);
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 1);
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
        arith_encode(cinfo, st, 1);
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}